

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  bool bVar7;
  REF_CELL *ppRVar8;
  bool bVar9;
  REF_STATUS RVar10;
  REF_CELL *ppRVar11;
  long lVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL *ppRVar16;
  long lVar17;
  uint uVar18;
  REF_CELL pRVar19;
  ulong uVar20;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  int local_f8;
  int local_f4;
  ulong local_f0;
  int local_e8 [6];
  ulong local_d0;
  REF_CELL local_c8;
  REF_CELL *local_c0;
  REF_CELL *local_b8;
  REF_CELL local_b0;
  undefined8 local_a8;
  int iStack_a0;
  int iStack_9c;
  
  local_b8 = ref_grid->cell;
  pRVar19 = ref_grid->cell[3];
  ref_cell = ref_grid->cell[6];
  if (0 < pRVar19->max) {
    local_c0 = ref_grid->cell + 8;
    cell = 0;
    local_c8 = ref_cell;
    local_b0 = pRVar19;
    do {
      RVar10 = ref_cell_nodes(pRVar19,cell,(REF_INT *)&local_a8);
      if (RVar10 == 0) {
        local_d0 = CONCAT44(local_d0._4_4_,cell);
        local_e8[2] = iStack_a0;
        local_e8[0] = (int)local_a8;
        local_e8[1] = (int)((ulong)local_a8 >> 0x20);
        bVar7 = false;
        uVar20 = 8;
        ppRVar11 = local_c0;
        local_e8[3] = local_e8[0];
        do {
          pRVar19 = *ppRVar11;
          uVar18 = ref_cell_with_face(pRVar19,local_e8,&local_f4,&local_f8);
          if (uVar18 != 0) {
            uVar20 = (ulong)uVar18;
            pcVar14 = "with face";
            uVar13 = 0x2a0;
            goto LAB_001298fd;
          }
          if (local_f4 != -1) {
            if (local_f8 != -1) {
              local_f0 = uVar20;
              printf("group %d cell0 %d cell1 %d\n",uVar20 & 0xffffffff);
              if (0 < pRVar19->node_per) {
                uVar20 = 0;
                do {
                  pRVar4 = ref_grid->node->real;
                  lVar12 = (long)pRVar19->c2n[(long)local_f4 * (long)pRVar19->size_per + uVar20];
                  printf("cell0 node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],
                         pRVar4[lVar12 * 0xf + 1],pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
                  uVar20 = uVar20 + 1;
                } while ((int)uVar20 < pRVar19->node_per);
                if (0 < pRVar19->node_per) {
                  uVar20 = 0;
                  do {
                    pRVar4 = ref_grid->node->real;
                    lVar12 = (long)pRVar19->c2n[(long)local_f8 * (long)pRVar19->size_per + uVar20];
                    printf("cell1 node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],
                           pRVar4[lVar12 * 0xf + 1],pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
                    uVar20 = uVar20 + 1;
                  } while ((int)uVar20 < pRVar19->node_per);
                }
              }
              uVar20 = 0;
              do {
                pRVar4 = ref_grid->node->real;
                lVar12 = (long)local_e8[uVar20];
                printf("face node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],pRVar4[lVar12 * 0xf + 1],
                       pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
                uVar20 = uVar20 + 1;
              } while (uVar20 != 3);
              lVar12 = (long)local_f8;
              uVar20 = local_f0;
              if (lVar12 != -1) {
                pcVar14 = "boundary triangle with two cells";
                uVar13 = 0x2be;
                goto LAB_00129941;
              }
            }
            if (0 < (long)pRVar19->face_per) {
              pRVar5 = pRVar19->f2n;
              pRVar6 = pRVar19->c2n;
              lVar12 = (long)local_f4 * (long)pRVar19->size_per;
              lVar15 = 0;
              do {
                iVar1 = pRVar6[*(int *)((long)pRVar5 + lVar15) + lVar12];
                lVar17 = (long)(int)lVar12;
                bVar9 = bVar7;
                if ((iVar1 == pRVar6[*(int *)((long)pRVar5 + lVar15 + 0xc) + lVar17]) &&
                   (((((iVar2 = pRVar6[*(int *)((long)pRVar5 + lVar15 + 4) + lVar17],
                       (int)local_a8 == iVar2 && (local_a8._4_4_ == iVar1)) &&
                      (iStack_a0 == pRVar6[*(int *)((long)pRVar5 + lVar15 + 8) + lVar17])) ||
                     ((((local_a8._4_4_ == iVar2 && (iStack_a0 == iVar1)) &&
                       ((int)local_a8 == pRVar6[*(int *)((long)pRVar5 + lVar15 + 8) + lVar17])) ||
                      ((((int)local_a8 == iVar1 && (iStack_a0 == iVar2)) &&
                       (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar15 + 8) + lVar17]))))))
                    && (bVar9 = true, bVar7)))) {
                  uVar13 = 0x2cd;
                  goto LAB_00129875;
                }
                bVar7 = bVar9;
                lVar15 = lVar15 + 0x10;
              } while ((long)pRVar19->face_per * 0x10 != lVar15);
            }
          }
          pRVar19 = local_b0;
          ref_cell = local_c8;
          ppRVar11 = local_b8 + uVar20 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != 0x10);
        cell = (REF_INT)local_d0;
        if (bVar7) {
          local_a8 = CONCAT44(local_e8[1],local_e8[2]);
          iStack_a0 = local_e8[0];
          uVar18 = ref_cell_replace_whole(local_b0,(REF_INT)local_d0,(REF_INT *)&local_a8);
          if (uVar18 != 0) {
            uVar20 = (ulong)uVar18;
            pcVar14 = "replace with flip";
            uVar13 = 0x2d6;
            goto LAB_001298fd;
          }
        }
      }
      cell = cell + 1;
    } while (cell < pRVar19->max);
  }
  if (0 < ref_cell->max) {
    uVar20 = 0;
    local_c8 = ref_cell;
    do {
      RVar10 = ref_cell_nodes(ref_cell,(REF_INT)uVar20,(REF_INT *)&local_a8);
      if (RVar10 == 0) {
        local_e8[0] = (int)local_a8;
        local_e8[1] = (int)((ulong)local_a8 >> 0x20);
        local_e8[2] = iStack_a0;
        local_e8[3] = iStack_9c;
        bVar7 = false;
        ppRVar11 = ref_grid->cell + 8;
        ppRVar8 = (REF_CELL *)0x8;
        local_d0 = uVar20;
        do {
          ppRVar16 = ppRVar8;
          pRVar19 = *ppRVar11;
          uVar18 = ref_cell_with_face(pRVar19,local_e8,&local_f4,&local_f8);
          ref_cell = local_c8;
          uVar20 = local_d0;
          if (uVar18 != 0) {
            uVar20 = (ulong)uVar18;
            pcVar14 = "wf";
            uVar13 = 0x2de;
            goto LAB_001298fd;
          }
          local_c0 = ppRVar16;
          if ((long)local_f4 != -1) {
            lVar12 = (long)local_f8;
            if (lVar12 != -1) {
              pcVar14 = "boundary quad with two cells";
              uVar13 = 0x2e0;
LAB_00129941:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,uVar13,"ref_grid_inward_boundary_orientation",pcVar14,0xffffffffffffffff,
                     lVar12);
              return 1;
            }
            if (0 < (long)pRVar19->face_per) {
              pRVar5 = pRVar19->f2n;
              pRVar6 = pRVar19->c2n;
              lVar12 = (long)local_f4 * (long)pRVar19->size_per;
              local_f0 = CONCAT44(local_f0._4_4_,iStack_9c);
              lVar15 = 0;
              do {
                iVar1 = pRVar6[*(int *)((long)pRVar5 + lVar15) + lVar12];
                lVar17 = (long)(int)lVar12;
                iVar2 = pRVar6[*(int *)((long)pRVar5 + lVar15 + 0xc) + lVar17];
                bVar9 = bVar7;
                if ((iVar1 != iVar2) &&
                   (((((((int)local_a8 == iVar2 &&
                        (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar15 + 8) + lVar17])) &&
                       (iStack_a0 == pRVar6[*(int *)((long)pRVar5 + lVar15 + 4) + lVar17])) &&
                      (iStack_9c == iVar1)) ||
                     ((((iVar3 = pRVar6[*(int *)((long)pRVar5 + lVar15 + 8) + lVar17],
                        (int)local_a8 == iVar3 &&
                        (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar15 + 4) + lVar17])) &&
                       ((iStack_a0 == iVar1 && (iStack_9c == iVar2)))) ||
                      ((((((int)local_a8 == pRVar6[*(int *)((long)pRVar5 + lVar15 + 4) + lVar17] &&
                          (local_a8._4_4_ == iVar1)) && (iStack_a0 == iVar2)) &&
                        (iStack_9c == iVar3)) ||
                       (((((int)local_a8 == iVar1 && (local_a8._4_4_ == iVar2)) &&
                         (iStack_a0 == iVar3)) &&
                        (iStack_9c == pRVar6[*(int *)((long)pRVar5 + lVar15 + 4) + lVar17]))))))))
                    && (bVar9 = true, bVar7)))) {
                  uVar13 = 0x2f5;
LAB_00129875:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,uVar13,"ref_grid_inward_boundary_orientation","error, flip set twice");
                  return 1;
                }
                bVar7 = bVar9;
                lVar15 = lVar15 + 0x10;
              } while ((long)pRVar19->face_per * 0x10 != lVar15);
            }
          }
          ppRVar11 = local_b8 + (long)((long)ppRVar16 + 1);
          ppRVar8 = (REF_CELL *)((long)ppRVar16 + 1);
        } while ((REF_CELL *)((long)ppRVar16 + 1) != (REF_CELL *)0x10);
        if (bVar7) {
          local_a8 = CONCAT44(local_e8[2],local_e8[1]);
          iStack_a0 = local_e8[1];
          iStack_9c = local_e8[0];
          uVar18 = ref_cell_replace_whole(local_c8,(REF_INT)local_d0,(REF_INT *)&local_a8);
          if (uVar18 != 0) {
            uVar20 = (ulong)uVar18;
            pcVar14 = "replace with flip";
            uVar13 = 0x2ff;
LAB_001298fd:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   uVar13,"ref_grid_inward_boundary_orientation",uVar20,pcVar14);
            return (REF_STATUS)uVar20;
          }
        }
      }
      uVar18 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar18;
    } while ((int)uVar18 < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, cell0, cell1;
  REF_INT node;
  REF_INT face_nodes[4];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL flip;
  REF_INT face, group;

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    for (node = 0; node < 3; node++) face_nodes[node] = nodes[node];
    face_nodes[3] = face_nodes[0];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
          "with face");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      if (REF_EMPTY != cell1) {
        printf("group %d cell0 %d cell1 %d\n", group, cell0, cell1);
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell0 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell0)));
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell1 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell1)));
        }
        for (node = 0; node < 3; node++) {
          printf("face node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 1, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 2, face_nodes[node]));
        }
        /* RSS( ref_export_by_extension( ref_grid,
           "bc-flip-debug.tec" ), "ex tec"); */
        REIS(REF_EMPTY, cell1, "boundary triangle with two cells");
      }
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) !=
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip quad faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[2];
      nodes[1] = face_nodes[1];
      nodes[2] = face_nodes[0];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "replace with flip");
    }
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, nodes) {
    for (node = 0; node < 4; node++) face_nodes[node] = nodes[node];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "wf");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      REIS(REF_EMPTY, cell1, "boundary quad with two cells");
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) ==
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip tri faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 0, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 3, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 1, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[3];
      nodes[1] = face_nodes[2];
      nodes[2] = face_nodes[1];
      nodes[3] = face_nodes[0];
      RSS(ref_cell_replace_whole(qua, cell, nodes), "replace with flip");
    }
  }

  return REF_SUCCESS;
}